

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  reference pcVar1;
  AlphaNum *pAVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  LogMessage *pLVar6;
  LogFinisher local_152;
  byte local_151;
  LogMessage local_150;
  char *local_118;
  char *out;
  reference local_108;
  char *begin;
  size_type old_size;
  LogMessage local_f0;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  AlphaNum *local_28;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *result_local;
  
  local_28 = c;
  c_local = b;
  b_local = a;
  a_local = (AlphaNum *)result;
  pcVar3 = strings::AlphaNum::data(a);
  lVar4 = std::__cxx11::string::data();
  uVar5 = std::__cxx11::string::size();
  local_61 = 0;
  if ((ulong)((long)pcVar3 - lVar4) <= uVar5) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x636);
    local_61 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(local_75,pLVar6);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  pcVar3 = strings::AlphaNum::data(c_local);
  lVar4 = std::__cxx11::string::data();
  uVar5 = std::__cxx11::string::size();
  local_b1 = 0;
  if ((ulong)((long)pcVar3 - lVar4) <= uVar5) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x637);
    local_b1 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_b0,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_b2,pLVar6);
  }
  if ((local_b1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b0);
  }
  pcVar3 = strings::AlphaNum::data(local_28);
  lVar4 = std::__cxx11::string::data();
  uVar5 = std::__cxx11::string::size();
  old_size._7_1_ = 0;
  if ((ulong)((long)pcVar3 - lVar4) <= uVar5) {
    internal::LogMessage::LogMessage
              (&local_f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x638);
    old_size._7_1_ = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_f0,
                        "CHECK failed: (uintptr_t((c).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)((long)&old_size + 6),pLVar6);
  }
  if ((old_size._7_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_f0);
  }
  begin = (char *)std::__cxx11::string::size();
  pAVar2 = a_local;
  strings::AlphaNum::size(b_local);
  strings::AlphaNum::size(c_local);
  strings::AlphaNum::size(local_28);
  std::__cxx11::string::resize((ulong)pAVar2);
  out = (char *)std::__cxx11::string::begin();
  local_108 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&out);
  local_118 = Append2(local_108 + (long)begin,b_local,c_local);
  pcVar3 = Append1(local_118,local_28);
  pcVar1 = local_108;
  local_118 = pcVar3;
  lVar4 = std::__cxx11::string::size();
  local_151 = 0;
  if (pcVar3 != pcVar1 + lVar4) {
    internal::LogMessage::LogMessage
              (&local_150,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x63e);
    local_151 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_150,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_152,pLVar6);
  }
  if ((local_151 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_150);
  }
  return;
}

Assistant:

void StrAppend(std::string *result, const AlphaNum &a, const AlphaNum &b,
               const AlphaNum &c) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  GOOGLE_DCHECK_NO_OVERLAP(*result, c);
  std::string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size() + c.size());
  char *const begin = &*result->begin();
  char *out = Append2(begin + old_size, a, b);
  out = Append1(out, c);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}